

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_lexicon.h
# Opt level: O0

SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_> * __thiscall
SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::operator=
          (SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_> *this,
          SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_> *x)

{
  dense_hashtable_const_iterator<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
  f;
  dense_hashtable_const_iterator<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
  l;
  hash<int> *hasher;
  equal_to<int> *key_equal;
  IdSet *this_00;
  allocator<unsigned_int> local_f1;
  IdKeyEqual local_f0;
  IdKeyEqual local_e0;
  IdHasher local_d0;
  IdHasher local_c0;
  iterator local_b0;
  iterator local_98;
  dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
  local_80;
  SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_> *local_18;
  SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_> *x_local;
  SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_> *this_local;
  
  local_18 = x;
  x_local = this;
  std::vector<int,_std::allocator<int>_>::operator=(&this->values_,&x->values_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&this->begins_,&local_18->begins_);
  gtl::
  dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
  ::begin(&local_98,&local_18->id_set_);
  this_00 = &local_18->id_set_;
  gtl::
  dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
  ::end(&local_b0,this_00);
  local_d0.lexicon_ =
       (SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_> *)
       gtl::
       dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
       ::hash_funct((hasher *)&local_18->id_set_,this_00);
  hasher = IdHasher::hasher(&local_d0);
  IdHasher::IdHasher(&local_c0,hasher,this);
  local_f0.lexicon_ =
       (SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_> *)
       gtl::
       dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
       ::key_eq((key_equal *)&local_18->id_set_,
                (dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
                 *)hasher);
  key_equal = IdKeyEqual::key_equal(&local_f0);
  IdKeyEqual::IdKeyEqual(&local_e0,key_equal,this);
  std::allocator<unsigned_int>::allocator(&local_f1);
  f.pos = local_98.pos;
  f.ht = local_98.ht;
  f.end = local_98.end;
  l.pos = local_b0.pos;
  l.ht = local_b0.ht;
  l.end = local_b0.end;
  gtl::
  dense_hash_set<unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>
  ::
  dense_hash_set<gtl::dense_hashtable_const_iterator<unsigned_int,unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,gtl::dense_hash_set<unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>::Identity,gtl::dense_hash_set<unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>::SetKey,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>>
            ((dense_hash_set<unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>
              *)&local_80,f,l,&kEmptyKey,0,&local_c0,&local_e0,&local_f1);
  gtl::
  dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
  ::operator=(&this->id_set_,&local_80);
  gtl::
  dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
  ::~dense_hash_set(&local_80);
  std::allocator<unsigned_int>::~allocator(&local_f1);
  return this;
}

Assistant:

SequenceLexicon<T, Hasher, KeyEqual>&
SequenceLexicon<T, Hasher, KeyEqual>::operator=(const SequenceLexicon& x) {
  // Note that self-assignment is handled correctly by this code.
  values_ = x.values_;
  begins_ = x.begins_;
  // Unfortunately we can't copy-assign "id_set_" because we need to change
  // the "this" pointers associated with hasher() and key_equal().
  id_set_ = IdSet(x.id_set_.begin(), x.id_set_.end(), kEmptyKey, 0,
                  IdHasher(x.id_set_.hash_funct().hasher(), this),
                  IdKeyEqual(x.id_set_.key_eq().key_equal(), this));
  return *this;
}